

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

int __thiscall cmGraphVizWriter::CollectAllTargets(cmGraphVizWriter *this)

{
  char *pcVar1;
  mapped_type pcVar2;
  bool bVar3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar4;
  string *psVar5;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar6;
  int iVar7;
  pointer ppcVar8;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  ostringstream ostr;
  allocator local_229;
  cmGraphVizWriter *local_228;
  pointer local_220;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  *local_218;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_210;
  string *local_208;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_200;
  key_type local_1e8;
  key_type local_1c8;
  string local_1a8 [11];
  
  pvVar4 = this->LocalGenerators;
  local_208 = (string *)&this->GraphNodePrefix;
  local_210 = &this->TargetNamesNodes;
  local_218 = &this->TargetPtrs;
  iVar7 = 0;
  local_228 = this;
  for (local_220 = (pvVar4->
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
      local_220 !=
      (pvVar4->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; local_220 = local_220 + 1) {
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_200,
               &(*local_220)->GeneratorTargets);
    for (ppcVar8 = local_200._M_impl.super__Vector_impl_data._M_start;
        ppcVar8 != local_200._M_impl.super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::string((string *)local_1a8,pcVar1,(allocator *)&local_1e8);
      bVar3 = IgnoreThisTarget(local_228,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        this_00 = std::operator<<((ostream *)local_1a8,local_208);
        std::ostream::operator<<(this_00,iVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string((string *)&local_1c8,pcVar1,&local_229);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_210,&local_1c8);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        pcVar2 = *ppcVar8;
        std::__cxx11::string::string((string *)&local_1e8,pcVar1,(allocator *)&local_1c8);
        ppcVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                  ::operator[](local_218,&local_1e8);
        iVar7 = iVar7 + 1;
        *ppcVar6 = pcVar2;
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      }
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_200);
    pvVar4 = local_228->LocalGenerators;
  }
  return iVar7;
}

Assistant:

int cmGraphVizWriter::CollectAllTargets()
{
  int cnt = 0;
  // First pass get the list of all cmake targets
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
         this->LocalGenerators.begin();
       lit != this->LocalGenerators.end(); ++lit) {
    std::vector<cmGeneratorTarget*> targets = (*lit)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator it = targets.begin();
         it != targets.end(); ++it) {
      const char* realTargetName = (*it)->GetName().c_str();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      // std::cout << "Found target: " << tit->first << std::endl;
      std::ostringstream ostr;
      ostr << this->GraphNodePrefix << cnt++;
      this->TargetNamesNodes[realTargetName] = ostr.str();
      this->TargetPtrs[realTargetName] = *it;
    }
  }

  return cnt;
}